

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O1

bool duckdb::ContainsSink(PhysicalOperator *op)

{
  pointer prVar1;
  bool bVar2;
  int iVar3;
  pointer prVar4;
  bool bVar5;
  
  iVar3 = (*op->_vptr_PhysicalOperator[0x21])();
  bVar5 = true;
  if ((char)iVar3 == '\0') {
    prVar4 = (op->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar1 = (op->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = prVar4 != prVar1;
    if (bVar5) {
      bVar2 = ContainsSink(prVar4->_M_data);
      while (!bVar2) {
        prVar4 = prVar4 + 1;
        bVar5 = prVar4 != prVar1;
        if (prVar4 == prVar1) {
          return bVar5;
        }
        bVar2 = ContainsSink(prVar4->_M_data);
      }
    }
  }
  return bVar5;
}

Assistant:

static bool ContainsSink(PhysicalOperator &op) {
	if (op.IsSink()) {
		return true;
	}
	for (auto &child : op.children) {
		if (ContainsSink(child)) {
			return true;
		}
	}
	return false;
}